

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void sysbvm_functionActivationEnvironment_setBindingActivationValue
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding,
               sysbvm_tuple_t value,sysbvm_tuple_t sourcePosition)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if ((*(long *)(binding + 0x38) != *(long *)(environment + 0x80)) &&
     (*(long *)(environment + 0x88) == 0)) {
LAB_001169ba:
    abort();
  }
  uVar4 = *(ulong *)(binding + 0x40);
  if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
    lVar5 = (long)uVar4 >> 4;
  }
  else {
    lVar5 = *(long *)(uVar4 + 0x10);
  }
  uVar4 = binding & 0xf;
  if (uVar4 == 0 && binding != 0) {
    sVar2 = *(sysbvm_tuple_t *)binding;
  }
  else if ((int)uVar4 == 0xf) {
    sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,binding >> 4);
  }
  else {
    sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
  }
  if (sVar2 == (context->roots).symbolLocalBindingType) {
    uVar1 = *(ulong *)(environment + 0x90);
    uVar4 = *(ulong *)(environment + 0xa0);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar3 = (long)uVar1 >> 4;
    }
    else {
      lVar3 = *(long *)(uVar1 + 0x10);
    }
    if ((uVar4 & 0xf) != 0 || uVar4 == 0) {
      return;
    }
    lVar5 = lVar5 + lVar3;
  }
  else {
    if (sVar2 != (context->roots).symbolArgumentBindingType) goto LAB_001169ba;
    uVar4 = *(ulong *)(environment + 0xa0);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      return;
    }
  }
  *(sysbvm_tuple_t *)(uVar4 + 0x10 + lVar5 * 8) = value;
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionActivationEnvironment_setBindingActivationValue(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding, sysbvm_tuple_t value, sysbvm_tuple_t sourcePosition)
{
    (void)sourcePosition;
    sysbvm_functionActivationEnvironment_t *activationEnvironment = (sysbvm_functionActivationEnvironment_t*)environment;
    sysbvm_symbolAnalysisBinding_t *analysisBinding = (sysbvm_symbolAnalysisBinding_t*)binding;
    if(analysisBinding->ownerFunction == activationEnvironment->functionDefinition || activationEnvironment->dependentFunctionType)
    {
        size_t vectorIndex = sysbvm_tuple_size_decode(analysisBinding->vectorIndex);
        sysbvm_tuple_t bindingType = sysbvm_tuple_getType(context, binding);
        if(bindingType == context->roots.symbolLocalBindingType)
        {
            sysbvm_array_atPut(activationEnvironment->valueVector, sysbvm_tuple_size_decode(activationEnvironment->argumentVectorSize) + vectorIndex, value);
            return;
        }
        else if(bindingType == context->roots.symbolArgumentBindingType)
        {
            sysbvm_array_atPut(activationEnvironment->valueVector, vectorIndex, value);
            return;
        }
    }
    abort();
}